

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O0

size_t merge_existing_groups
                 (econf_file *dest_kf,file_entry **fe,econf_file *uf,econf_file *ef,size_t etc_start
                 )

{
  file_entry *pfVar1;
  int iVar2;
  long lVar3;
  char *local_e0;
  file_entry local_d8;
  file_entry local_a0;
  ulong local_68;
  size_t k;
  size_t j;
  size_t i;
  size_t added_keys;
  size_t tmp;
  size_t merge_length;
  size_t sStack_30;
  _Bool new_key;
  size_t etc_start_local;
  econf_file *ef_local;
  econf_file *uf_local;
  file_entry **fe_local;
  econf_file *dest_kf_local;
  
  tmp = etc_start;
  if ((uf != (econf_file *)0x0) && (ef != (econf_file *)0x0)) {
    j = 0;
    i = etc_start;
    added_keys = etc_start;
    sStack_30 = etc_start;
    etc_start_local = (size_t)ef;
    ef_local = uf;
    uf_local = (econf_file *)fe;
    fe_local = &dest_kf->file_entry;
    for (; j <= ef_local->length; j = j + 1) {
      if ((j == ef_local->length) ||
         ((j != 0 &&
          (iVar2 = strcmp(ef_local->file_entry[j].group,ef_local->file_entry[j - 1].group),
          iVar2 != 0)))) {
        for (k = sStack_30; k < *(ulong *)(etc_start_local + 8); k = k + 1) {
          iVar2 = strcmp(ef_local->file_entry[j - 1].group,
                         *(char **)(*(long *)etc_start_local + k * 0x38));
          if (iVar2 == 0) {
            merge_length._7_1_ = 1;
            for (local_68 = tmp; local_68 < j + added_keys; local_68 = local_68 + 1) {
              iVar2 = strcmp(uf_local->file_entry[local_68].key,
                             *(char **)(*(long *)etc_start_local + k * 0x38 + 8));
              if (iVar2 == 0) {
                free(uf_local->file_entry[local_68].value);
                if (*(long *)(*(long *)etc_start_local + k * 0x38 + 0x10) == 0) {
                  local_e0 = strdup("");
                }
                else {
                  local_e0 = strdup(*(char **)(*(long *)etc_start_local + k * 0x38 + 0x10));
                }
                uf_local->file_entry[local_68].value = local_e0;
                merge_length._7_1_ = 0;
                break;
              }
            }
            if ((merge_length._7_1_ & 1) != 0) {
              pfVar1 = uf_local->file_entry;
              lVar3 = j + i;
              i = i + 1;
              cpy_file_entry(&local_a0,(econf_file *)fe_local,
                             *(file_entry *)(*(long *)etc_start_local + k * 0x38));
              memcpy(pfVar1 + lVar3,&local_a0,0x38);
            }
          }
        }
        tmp = j + i;
        added_keys = i;
      }
      if (j != ef_local->length) {
        pfVar1 = uf_local->file_entry;
        lVar3 = j + i;
        cpy_file_entry(&local_d8,(econf_file *)fe_local,ef_local->file_entry[j]);
        memcpy(pfVar1 + lVar3,&local_d8,0x38);
      }
    }
  }
  return tmp;
}

Assistant:

size_t merge_existing_groups(econf_file *dest_kf, struct file_entry **fe, econf_file *uf,
			     econf_file *ef, const size_t etc_start) {
  bool new_key;
  size_t merge_length = etc_start, tmp = etc_start, added_keys = etc_start;
  if (uf && ef) {
    for (size_t i = 0; i <= uf->length; i++) {
      // Check if the group has changed in the last iteration
      if (i == uf->length ||
	  (i && strcmp(uf->file_entry[i].group, uf->file_entry[i - 1].group))) {
	for (size_t j = etc_start; j < ef->length; j++) {
	  // Check for matching groups
	  if (!strcmp(uf->file_entry[i - 1].group, ef->file_entry[j].group)) {
	    new_key = true;
	    for (size_t k = merge_length; k < i + tmp; k++) {
	      // If an existing key is found in ef take the value from ef
	      if (!strcmp((*fe)[k].key, ef->file_entry[j].key)) {
		free((*fe)[k].value);
		(*fe)[k].value = ef->file_entry[j].value ? strdup(ef->file_entry[j].value) : strdup("");
		new_key = false;
		break;
	      }
	    }
	    // If a new key is found for an existing group append it to the group
	    if (new_key)
	      (*fe)[i + added_keys++] = cpy_file_entry(dest_kf, ef->file_entry[j]);
	  }
	}
	merge_length = i + added_keys;
	// Temporary value to reduce amount of iterations in inner for loop
	tmp = added_keys;
      }
      if (i != uf->length)
	(*fe)[i + added_keys] = cpy_file_entry(dest_kf, uf->file_entry[i]);
    }
  }
  return merge_length;
}